

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O2

Ptr __thiscall
TgBot::Api::sendAnimation
          (Api *this,Api *chatId,int64_t animation,
          variant<std::shared_ptr<TgBot::InputFile>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *param_4,int32_t width,int32_t height,int param_7,
          variant<std::shared_ptr<TgBot::InputFile>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *param_8,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_9,
          int param_10,Ptr *param_11,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_12,char param_13)

{
  int iVar1;
  char cVar2;
  __shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  type pbVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar5;
  bool disableNotification_local;
  allocator local_a1;
  int32_t width_local;
  int32_t duration_local;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> args;
  shared_ptr<TgBot::InputFile> file;
  int64_t chatId_local;
  string local_48;
  
  cVar2 = param_13;
  iVar1 = param_10;
  disableNotification_local = (bool)param_13;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  width_local = height;
  duration_local = width;
  chatId_local = animation;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve(&args,0xb);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],long&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
             (char (*) [8])0x27334a,&chatId_local);
  if (*(int *)param_4 >> 0x1f == *(int *)param_4) {
    p_Var3 = &boost::
              relaxed_get<std::shared_ptr<TgBot::InputFile>,std::shared_ptr<TgBot::InputFile>,std::__cxx11::string>
                        (param_4)->super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&file.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>,p_Var3);
    local_48._M_dataplus._M_p._0_1_ = 1;
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[10],std::__cxx11::string&,bool,std::__cxx11::string&,std::__cxx11::string&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [10])"animation",
               &(file.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->data
               ,(bool *)&local_48,
               &(file.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                mimeType,
               &(file.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                fileName);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&file.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    pbVar4 = boost::
             relaxed_get<std::__cxx11::string,std::shared_ptr<TgBot::InputFile>,std::__cxx11::string>
                       (param_4);
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[10],std::__cxx11::string_const&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [10])"animation",pbVar4);
  }
  if (duration_local != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[9],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [9])0x2736be,&duration_local);
  }
  if (width_local != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[6],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [6])0x2736a5,&width_local);
  }
  if (param_7 != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[7],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [7])0x2736b1,&param_7);
  }
  if (*(int *)param_8 >> 0x1f == *(int *)param_8) {
    p_Var3 = &boost::
              relaxed_get<std::shared_ptr<TgBot::InputFile>,std::shared_ptr<TgBot::InputFile>,std::__cxx11::string>
                        (param_8)->super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&file.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>,p_Var3);
    local_48._M_dataplus._M_p._0_1_ = 1;
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[6],std::__cxx11::string&,bool,std::__cxx11::string&,std::__cxx11::string&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [6])"thumb",
               &(file.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->data
               ,(bool *)&local_48,
               &(file.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                mimeType,
               &(file.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                fileName);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&file.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    pbVar4 = boost::
             relaxed_get<std::__cxx11::string,std::shared_ptr<TgBot::InputFile>,std::__cxx11::string>
                       (param_8);
    std::__cxx11::string::string((string *)&file,(string *)pbVar4);
    if (file.super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
      emplace_back<char_const(&)[6],std::__cxx11::string&>
                ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
                 (char (*) [6])"thumb",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
    }
    std::__cxx11::string::~string((string *)&file);
  }
  if (param_9->_M_string_length != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[8],std::__cxx11::string_const&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [8])"caption",param_9);
  }
  if (iVar1 != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[20],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [20])"reply_to_message_id",&param_10);
  }
  if ((param_11->super___shared_ptr<TgBot::GenericReply,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    TgTypeParser::parseGenericReply_abi_cxx11_
              ((string *)&file,(TgTypeParser *)&chatId->field_0x28,param_11);
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[13],std::__cxx11::string>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [13])"reply_markup",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
    std::__cxx11::string::~string((string *)&file);
  }
  if (param_12->_M_string_length != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[11],std::__cxx11::string_const&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [11])"parse_mode",param_12);
  }
  if (cVar2 != '\0') {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[21],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
               (char (*) [21])"disable_notification",&disableNotification_local);
  }
  std::__cxx11::string::string((string *)&local_48,"sendAnimation",&local_a1);
  sendRequest((ptree *)&file,chatId,&local_48,&args);
  TgTypeParser::parseJsonAndGetMessage((TgTypeParser *)this,(ptree *)&chatId->field_0x28);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree((basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&file);
  std::__cxx11::string::~string((string *)&local_48);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector(&args);
  PVar5.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar5.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (Ptr)PVar5.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Message::Ptr Api::sendAnimation(int64_t chatId, const boost::variant<InputFile::Ptr, std::string> animation, int32_t duration, int32_t width, int32_t height, const boost::variant<InputFile::Ptr, std::string> thumb, const string& caption, int32_t replyToMessageId, GenericReply::Ptr replyMarkup, const string& parseMode, bool disableNotification) const {
    vector<HttpReqArg> args;
    args.reserve(11);
    args.emplace_back("chat_id", chatId);
    if (animation.which() == 0 /* InputFile::Ptr */) {
        auto file = boost::get<InputFile::Ptr>(animation);
        args.emplace_back("animation", file->data, true, file->mimeType, file->fileName);
    } else /* std::string */ {
        args.emplace_back("animation", boost::get<std::string>(animation));
    }
    if (duration) {
        args.emplace_back("duration", duration);
    }
    if (width) {
        args.emplace_back("width", width);
    }
    if (height) {
        args.emplace_back("height", height);
    }
    if (thumb.which() == 0 /* InputFile::Ptr */) {
        auto file = boost::get<InputFile::Ptr>(thumb);
        args.emplace_back("thumb", file->data, true, file->mimeType, file->fileName);
    } else /* std::string */ {
        auto thumbStr = boost::get<std::string>(thumb);
        if (!thumbStr.empty()) {
            args.emplace_back("thumb", thumbStr);
        }
    }
    if (!caption.empty()) {
        args.emplace_back("caption", caption);
    }
    if (replyToMessageId) {
        args.emplace_back("reply_to_message_id", replyToMessageId);
    }
    if (replyMarkup) {
        args.emplace_back("reply_markup", _tgTypeParser.parseGenericReply(replyMarkup));
    }
    if (!parseMode.empty()) {
        args.emplace_back("parse_mode", parseMode);
    }
    if (disableNotification){
        args.emplace_back("disable_notification", disableNotification);
    }
    return _tgTypeParser.parseJsonAndGetMessage(sendRequest("sendAnimation", args));
}